

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

natwm_error workspace_focus_client(natwm_state *state,workspace *workspace,client *client)

{
  list *node;
  natwm_error nVar1;
  
  nVar1 = INVALID_INPUT_ERROR;
  if ((client->is_focused == false) && ((client->state & CLIENT_HIDDEN) == 0)) {
    node = workspace->clients;
    do {
      node = (list *)node->head;
      if (node == (list *)0x0) {
        return NOT_FOUND_ERROR;
      }
    } while (client->window != *(xcb_window_t *)node->size);
    focus_client(state,workspace,(node *)node,client);
    nVar1 = NO_ERROR;
    if (workspace->is_focused == false) {
      workspace_set_focused(state,workspace);
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error workspace_focus_client(struct natwm_state *state, struct workspace *workspace,
                                        struct client *client)
{
        if (client->is_focused || client->state & CLIENT_HIDDEN) {
                return INVALID_INPUT_ERROR;
        }

        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        }

        focus_client(state, workspace, client_node, client);

        if (!workspace->is_focused) {
                workspace_set_focused(state, workspace);
        }

        return NO_ERROR;
}